

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O1

void split_buffer(ui32_t sample_size,FrameBuffer *FrameBuffer,FrameBuffer *L_FrameBuffer,
                 FrameBuffer *R_FrameBuffer)

{
  uint uVar1;
  ulong __n;
  void *pvVar2;
  void *__dest;
  void *__dest_00;
  void *__src;
  
  uVar1 = *(uint *)&FrameBuffer->field_0x18;
  if ((uVar1 & 1) == 0) {
    if ((ulong)uVar1 != 0) {
      __src = *(void **)&FrameBuffer->field_0x8;
      pvVar2 = (void *)((ulong)uVar1 + (long)__src);
      __dest = *(void **)&R_FrameBuffer->field_0x8;
      __dest_00 = *(void **)&L_FrameBuffer->field_0x8;
      __n = (ulong)sample_size;
      do {
        memcpy(__dest_00,__src,__n);
        __dest_00 = (void *)((long)__dest_00 + __n);
        memcpy(__dest,(void *)((long)__src + __n),__n);
        __dest = (void *)((long)__dest + __n);
        __src = (void *)((long)((long)__src + __n) + __n);
      } while (__src < pvVar2);
    }
    *(undefined4 *)&L_FrameBuffer->field_0x18 = *(undefined4 *)&L_FrameBuffer->field_0x10;
    *(undefined4 *)&R_FrameBuffer->field_0x18 = *(undefined4 *)&R_FrameBuffer->field_0x10;
    return;
  }
  __assert_fail("(FrameBuffer.Size() % 2) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/wavesplit.cpp"
                ,0xda,
                "void split_buffer(ui32_t, PCM::FrameBuffer &, PCM::FrameBuffer &, PCM::FrameBuffer &)"
               );
}

Assistant:

void
split_buffer(ui32_t sample_size, PCM::FrameBuffer& FrameBuffer,
	     PCM::FrameBuffer& L_FrameBuffer, PCM::FrameBuffer& R_FrameBuffer)
{
  assert((FrameBuffer.Size() % 2) == 0);
  byte_t* p = FrameBuffer.Data();
  byte_t* end_p = p + FrameBuffer.Size();
  byte_t* lp = L_FrameBuffer.Data();
  byte_t* rp = R_FrameBuffer.Data();

  for ( ; p < end_p; )
    {
      memcpy(lp, p, sample_size);
      lp += sample_size;
      p += sample_size;
      memcpy(rp, p, sample_size);
      rp += sample_size;
      p += sample_size;
    }

  L_FrameBuffer.Size(L_FrameBuffer.Capacity());
  R_FrameBuffer.Size(R_FrameBuffer.Capacity());
}